

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O2

CatalogEntry * __thiscall
duckdb::CatalogSet::GetEntryForTransaction
          (CatalogSet *this,CatalogTransaction transaction,CatalogEntry *current,bool *visible)

{
  ulong uVar1;
  bool bVar2;
  
  while ((current->child).
         super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
         super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
         super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl != (CatalogEntry *)0x0) {
    uVar1 = (current->timestamp).super___atomic_base<unsigned_long>._M_i;
    bVar2 = true;
    if ((transaction.transaction_id == uVar1) || (uVar1 < transaction.start_time))
    goto LAB_0160a24c;
    current = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
              operator*(&current->child);
  }
  bVar2 = false;
LAB_0160a24c:
  *visible = bVar2;
  return current;
}

Assistant:

CatalogEntry &CatalogSet::GetEntryForTransaction(CatalogTransaction transaction, CatalogEntry &current, bool &visible) {
	reference<CatalogEntry> entry(current);
	while (entry.get().HasChild()) {
		if (UseTimestamp(transaction, entry.get().timestamp)) {
			visible = true;
			return entry.get();
		}
		entry = entry.get().Child();
	}
	visible = false;
	return entry.get();
}